

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O3

vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *
CfdTestGenerateUtxo(vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *__return_storage_ptr__,
                   NetType net_type,HDWallet *wallet,string *base_path,Amount *amount,
                   uint32_t offset,uint32_t count,
                   vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *privkey_list)

{
  undefined8 *puVar1;
  char cVar2;
  char cVar3;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_RAX;
  undefined8 *puVar4;
  long *plVar5;
  pointer __dest;
  uint uVar6;
  _func_int **pp_Var7;
  ulong *puVar8;
  long *plVar9;
  ulong uVar10;
  uint __val;
  size_t __n;
  undefined4 in_register_00000034;
  undefined4 in_register_0000008c;
  bool bVar11;
  ByteData256 txid_bytes;
  DescriptorScriptReference ref;
  Descriptor desc;
  UtxoData utxo;
  KeyData key;
  undefined8 *local_d68;
  undefined8 local_d58;
  undefined8 uStack_d50;
  ByteData256 local_d48;
  long lStack_d30;
  uint local_d24;
  vector<cfd::UtxoData,std::allocator<cfd::UtxoData>> *local_d20;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *local_d18;
  string *local_d10;
  void *local_d08;
  void *local_d00;
  code *local_cf0;
  string *local_ce8;
  HDWallet *local_ce0;
  undefined1 *local_cd8 [2];
  undefined1 local_cc8 [16];
  void *local_cb8;
  undefined1 local_ca0 [72];
  void *local_c58;
  void *local_c40;
  code *local_c28 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_bb0;
  Script local_b98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b58;
  ulong *local_b28;
  long local_b20;
  ulong local_b18;
  long lStack_b10;
  undefined1 *local_7d8 [2];
  undefined1 local_7c8 [344];
  ulong *local_670;
  long local_668;
  ulong local_660 [3];
  Txid local_648;
  uint local_628;
  Script local_620 [2];
  Address local_5b0 [376];
  string local_438 [32];
  pointer local_418;
  undefined1 local_410;
  undefined4 local_408;
  KeyData local_180;
  
  local_d18 = (vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)
              CONCAT44(in_register_0000008c,offset);
  local_d10 = (string *)CONCAT44(in_register_00000034,net_type);
  (__return_storage_ptr__->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d24 = (uint)amount;
  if (local_d24 != 0) {
    local_cf0 = cfd::core::Psbt::CheckTxInIndex;
    __val = 1;
    local_d20 = (vector<cfd::UtxoData,std::allocator<cfd::UtxoData>> *)__return_storage_ptr__;
    local_ce8 = base_path;
    local_ce0 = wallet;
    do {
      local_d68 = &local_d58;
      local_670 = local_660;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_670,*(long *)local_ce0,
                 *(long *)(local_ce0 + 8) + *(long *)local_ce0);
      std::__cxx11::string::append((char *)&local_670);
      cVar3 = '\x01';
      if (9 < __val) {
        uVar10 = (ulong)__val;
        cVar2 = '\x04';
        do {
          cVar3 = cVar2;
          uVar6 = (uint)uVar10;
          if (uVar6 < 100) {
            cVar3 = cVar3 + -2;
            goto LAB_001c5acc;
          }
          if (uVar6 < 1000) {
            cVar3 = cVar3 + -1;
            goto LAB_001c5acc;
          }
          if (uVar6 < 10000) goto LAB_001c5acc;
          uVar10 = uVar10 / 10000;
          cVar2 = cVar3 + '\x04';
        } while (99999 < uVar6);
        cVar3 = cVar3 + '\x01';
      }
LAB_001c5acc:
      local_b28 = &local_b18;
      std::__cxx11::string::_M_construct((ulong)&local_b28,cVar3);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b28,(uint)local_b20,__val);
      uVar10 = 0xf;
      if (local_670 != local_660) {
        uVar10 = local_660[0];
      }
      if (uVar10 < (ulong)(local_b20 + local_668)) {
        uVar10 = 0xf;
        if (local_b28 != &local_b18) {
          uVar10 = local_b18;
        }
        if (uVar10 < (ulong)(local_b20 + local_668)) goto LAB_001c5b5d;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_b28,0,(char *)0x0,(ulong)local_670);
      }
      else {
LAB_001c5b5d:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_670,(ulong)local_b28);
      }
      puVar1 = puVar4 + 2;
      if ((undefined8 *)*puVar4 == puVar1) {
        local_d58 = *puVar1;
        uStack_d50 = puVar4[3];
      }
      else {
        local_d58 = *puVar1;
        local_d68 = (undefined8 *)*puVar4;
      }
      *puVar4 = puVar1;
      puVar4[1] = 0;
      *(undefined1 *)puVar1 = 0;
      if (local_b28 != &local_b18) {
        operator_delete(local_b28);
      }
      if (local_670 != local_660) {
        operator_delete(local_670);
      }
      cfd::core::HDWallet::GeneratePrivkeyData((NetType)&local_180,local_d10);
      cfd::UtxoData::UtxoData((UtxoData *)&local_670);
      cfd::core::KeyData::ToString_abi_cxx11_(SUB81(local_7d8,0),(HardenedType)&local_180,true);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_7d8,0,(char *)0x0,0x25b8bf);
      local_ca0._0_8_ = local_ca0 + 0x10;
      pp_Var7 = (_func_int **)(plVar5 + 2);
      if ((_func_int **)*plVar5 == pp_Var7) {
        local_ca0._16_8_ = *pp_Var7;
        local_ca0._24_8_ = plVar5[3];
      }
      else {
        local_ca0._16_8_ = *pp_Var7;
        local_ca0._0_8_ = (_func_int **)*plVar5;
      }
      local_ca0._8_8_ = plVar5[1];
      *plVar5 = (long)pp_Var7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append(local_ca0);
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_b18 = *puVar8;
        lStack_b10 = plVar5[3];
        local_b28 = &local_b18;
      }
      else {
        local_b18 = *puVar8;
        local_b28 = (ulong *)*plVar5;
      }
      local_b20 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::operator=(local_438,(string *)&local_b28);
      if (local_b28 != &local_b18) {
        operator_delete(local_b28);
      }
      if ((undefined1 *)local_ca0._0_8_ != local_ca0 + 0x10) {
        operator_delete((void *)local_ca0._0_8_);
      }
      if (local_7d8[0] != local_7c8) {
        operator_delete(local_7d8[0]);
      }
      local_410 = (undefined1)local_ce8->_M_string_length;
      local_418 = (local_ce8->_M_dataplus)._M_p;
      cfd::core::Descriptor::Parse((string *)local_7d8,(vector *)local_438);
      cfd::core::Descriptor::GetReference((vector *)&local_b28);
      cfd::core::DescriptorScriptReference::GetLockingScript();
      cfd::core::Script::operator=(local_620,(Script *)local_ca0);
      cfd::core::Script::~Script((Script *)local_ca0);
      cfd::core::DescriptorScriptReference::GenerateAddress((NetType)(Script *)local_ca0);
      cfd::core::Address::operator=(local_5b0,(Address *)local_ca0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_b58);
      cfd::core::Script::~Script(&local_b98);
      local_c28[0] = local_cf0;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_bb0);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_c28);
      if (local_c40 != (void *)0x0) {
        operator_delete(local_c40);
      }
      if (local_c58 != (void *)0x0) {
        operator_delete(local_c58);
      }
      if ((void *)local_ca0._48_8_ != (void *)0x0) {
        operator_delete((void *)local_ca0._48_8_);
      }
      if ((undefined1 *)local_ca0._16_8_ != local_ca0 + 0x20) {
        operator_delete((void *)local_ca0._16_8_);
      }
      local_408 = 4;
      cfd::core::HDWallet::GetSeed();
      cfd::core::ByteData::GetHex_abi_cxx11_();
      plVar5 = (long *)std::__cxx11::string::append((char *)local_cd8);
      local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&local_d48.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
      plVar9 = plVar5 + 2;
      if ((pointer *)*plVar5 == (pointer *)plVar9) {
        local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*plVar9;
        lStack_d30 = plVar5[3];
      }
      else {
        local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*plVar9;
        local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)*plVar5;
      }
      local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)plVar5[1];
      *plVar5 = (long)plVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_d48,(ulong)local_d68);
      pp_Var7 = (_func_int **)(plVar5 + 2);
      if ((_func_int **)*plVar5 == pp_Var7) {
        local_ca0._16_8_ = *pp_Var7;
        local_ca0._24_8_ = plVar5[3];
        local_ca0._0_8_ = local_ca0 + 0x10;
      }
      else {
        local_ca0._16_8_ = *pp_Var7;
        local_ca0._0_8_ = (_func_int **)*plVar5;
      }
      local_ca0._8_8_ = plVar5[1];
      *plVar5 = (long)pp_Var7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      cfd::core::HashUtil::Sha256((string *)&local_d08);
      if ((undefined1 *)local_ca0._0_8_ != local_ca0 + 0x10) {
        operator_delete((void *)local_ca0._0_8_);
      }
      if ((pointer *)
          local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_d48.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_cd8[0] != local_cc8) {
        operator_delete(local_cd8[0]);
      }
      if (local_cb8 != (void *)0x0) {
        operator_delete(local_cb8);
      }
      local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar10 = (long)local_d00 - (long)local_d08;
      if (uVar10 == 0) {
        __dest = (pointer)0x0;
        __n = 0;
      }
      else {
        if ((long)uVar10 < 0) {
          std::__throw_bad_alloc();
        }
        __dest = (pointer)operator_new(uVar10);
        __n = (long)local_d00 - (long)local_d08;
      }
      local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = __dest + uVar10;
      local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = __dest;
      if (local_d00 != local_d08) {
        local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = __dest;
        memmove(__dest,local_d08,__n);
      }
      local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = __dest + __n;
      cfd::core::Txid::Txid((Txid *)local_ca0,&local_d48);
      cfd::core::Txid::operator=(&local_648,(Txid *)local_ca0);
      local_ca0._0_8_ = &PTR__Txid_002dbe60;
      if ((pointer)local_ca0._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_ca0._8_8_);
      }
      if (local_d48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d48.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_628 = __val;
      std::vector<cfd::UtxoData,std::allocator<cfd::UtxoData>>::emplace_back<cfd::UtxoData&>
                (local_d20,(UtxoData *)&local_670);
      if (local_d18 != (vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> *)0x0) {
        cfd::core::KeyData::GetPrivkey();
        std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::
        emplace_back<cfd::core::Privkey>(local_d18,(Privkey *)local_ca0);
        if ((_func_int **)local_ca0._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_ca0._0_8_);
        }
      }
      if (local_d08 != (void *)0x0) {
        operator_delete(local_d08);
      }
      cfd::core::DescriptorScriptReference::~DescriptorScriptReference
                ((DescriptorScriptReference *)&local_b28);
      cfd::core::DescriptorNode::~DescriptorNode((DescriptorNode *)local_7d8);
      cfd::UtxoData::~UtxoData((UtxoData *)&local_670);
      cfd::core::KeyData::~KeyData(&local_180);
      if (local_d68 != &local_d58) {
        operator_delete(local_d68);
      }
      in_RAX = (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)(ulong)(__val + 1);
      bVar11 = __val != local_d24;
      __val = __val + 1;
    } while (bVar11);
  }
  return in_RAX;
}

Assistant:

static std::vector<UtxoData> CfdTestGenerateUtxo(
    NetType net_type, const HDWallet& wallet, const std::string& base_path,
    const Amount& amount, uint32_t offset, uint32_t count,
    std::vector<Privkey>* privkey_list) {
  std::vector<UtxoData> list;
  for (uint32_t index=offset; index<(offset + count); ++index) {
    std::string path = base_path + "/" + std::to_string(index);
    auto key = wallet.GeneratePrivkeyData(net_type, path);
    UtxoData utxo;
    utxo.descriptor = "wpkh(" + key.ToString() + ")";
    utxo.amount = amount;
    Descriptor desc = Descriptor::Parse(utxo.descriptor);
    auto ref = desc.GetReference();
    utxo.locking_script = ref.GetLockingScript();
    utxo.address = ref.GenerateAddress(net_type);
    utxo.address_type  = AddressType::kP2wpkhAddress;
    auto txid_bytes = HashUtil::Sha256(wallet.GetSeed().GetHex() + "/" + path);
    utxo.txid = Txid(ByteData256(txid_bytes));
    utxo.vout = index;
    list.emplace_back(utxo);
    if (privkey_list != nullptr) {
      privkey_list->push_back(key.GetPrivkey());
    }
  }
  return list;
}